

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryWriter::writeStrings(WasmBinaryWriter *this)

{
  __node_base_ptr *__dest;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  *this_00;
  pointer puVar1;
  Global *pGVar2;
  pointer ppEVar3;
  pointer puVar4;
  DataSegment *pDVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  WasmBinaryWriter *pWVar9;
  iterator iVar10;
  bool bVar11;
  int32_t iVar12;
  _Rb_tree_node_base *p_Var13;
  ulong uVar14;
  mapped_type *pmVar15;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  ElementSegment *pEVar16;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  pointer puVar17;
  _Base_ptr p_Var18;
  string_view *psVar19;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar20;
  pointer puVar21;
  long *plVar22;
  ulong uVar23;
  pointer ppEVar24;
  string_view name;
  undefined1 auStack_2a8 [8];
  stringstream wtf8;
  ostream local_298 [112];
  ios_base local_228 [48];
  pointer local_1f8;
  pointer pTStack_1f0;
  pointer local_1e8;
  Function *pFStack_1e0;
  Module *local_1d8;
  mapped_type *local_1d0;
  undefined1 local_118 [8];
  ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  StringSet allStrings;
  Expression *local_80;
  size_t local_78;
  Expression local_70;
  Module *local_60;
  pointer local_58;
  WasmBinaryWriter *local_50;
  string_view *local_48;
  iterator iStack_40;
  Name *local_38;
  
  local_50 = this;
  if (((this->wasm->features).features & 0x4000) == 0) {
    __assert_fail("wasm->features.hasStrings()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x1ed,"void wasm::WasmBinaryWriter::writeStrings()");
  }
  allStrings._M_h._M_single_bucket = (__node_base_ptr)0x0;
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)local_118,this->wasm,(Func *)&allStrings._M_h._M_single_bucket);
  __dest = &allStrings._M_h._M_single_bucket;
  std::
  _Function_handler<void_(wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp:508:12)>
  ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  auStack_2a8 = (undefined1  [8])0x0;
  local_1d0 = std::
              map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
              ::operator[]((map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                            *)&analysis,(key_type *)auStack_2a8);
  auStack_2a8 = (undefined1  [8])0x0;
  _wtf8 = 0;
  local_1f8 = (pointer)0x0;
  pTStack_1f0 = (pointer)0x0;
  local_1e8 = (pointer)0x0;
  pFStack_1e0 = (Function *)0x0;
  local_1d8 = local_50->wasm;
  puVar20 = (local_1d8->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (local_1d8->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = local_1d8;
  if (puVar20 != puVar1) {
    do {
      pGVar2 = (puVar20->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar2->super_Importable).module + 8) == (char *)0x0) {
        Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_>::walk
                  ((Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_> *)auStack_2a8,
                   &pGVar2->init);
      }
      puVar20 = puVar20 + 1;
    } while (puVar20 != puVar1);
  }
  puVar17 = (local_60->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (local_60->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar17 != local_58) {
    do {
      pEVar16 = (puVar17->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (pEVar16->offset != (Expression *)0x0) {
        Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_>::walk
                  ((Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_> *)auStack_2a8,
                   &pEVar16->offset);
        pEVar16 = (puVar17->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      }
      ppEVar3 = *(pointer *)
                 ((long)&(pEVar16->data).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl + 8);
      for (ppEVar24 = (pEVar16->data).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppEVar24 != ppEVar3;
          ppEVar24 = ppEVar24 + 1) {
        analysis._48_8_ = *ppEVar24;
        Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_>::walk
                  ((Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_> *)auStack_2a8,
                   (Expression **)&analysis.field_0x30);
      }
      puVar17 = puVar17 + 1;
    } while (puVar17 != local_58);
  }
  puVar21 = (local_60->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (local_60->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar21 != puVar4) {
    do {
      pDVar5 = (puVar21->_M_t).
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar5->offset != (Expression *)0x0) {
        Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_>::walk
                  ((Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_> *)auStack_2a8,
                   &pDVar5->offset);
      }
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar4);
  }
  local_1d8 = (Module *)0x0;
  if (local_1f8 != (pointer)0x0) {
    operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
  }
  analysis._48_8_ = &allStrings._M_h._M_rehash_policy._M_next_resize;
  allStrings._M_h._M_buckets = (__buckets_ptr)0x1;
  allStrings._M_h._M_bucket_count = 0;
  allStrings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  allStrings._M_h._M_element_count._0_4_ = 0x3f800000;
  allStrings._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  allStrings._M_h._M_rehash_policy._4_4_ = 0;
  allStrings._M_h._M_rehash_policy._M_next_resize = 0;
  if ((undefined1 *)analysis._24_8_ != &analysis.field_0x8) {
    p_Var13 = (_Rb_tree_node_base *)analysis._24_8_;
    do {
      for (p_Var18 = p_Var13[1]._M_right; p_Var18 != (_Base_ptr)0x0; p_Var18 = *(_Base_ptr *)p_Var18
          ) {
        auStack_2a8 = (undefined1  [8])&analysis.field_0x30;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&analysis.field_0x30,&p_Var18->_M_parent,auStack_2a8);
      }
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != (_Rb_tree_node_base *)&analysis.field_0x8);
    local_48 = (string_view *)0x0;
    iStack_40._M_current = (Name *)0x0;
    local_38 = (Name *)0x0;
    if (allStrings._M_h._M_bucket_count != 0) {
      plVar22 = (long *)allStrings._M_h._M_bucket_count;
      do {
        if (iStack_40._M_current == local_38) {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)&local_48,iStack_40,
                     (Name *)(plVar22 + 1));
        }
        else {
          uVar7 = *(undefined4 *)((long)plVar22 + 0xc);
          lVar6 = plVar22[2];
          uVar8 = *(undefined4 *)((long)plVar22 + 0x14);
          *(int *)&((iStack_40._M_current)->super_IString).str._M_len =
               (int)(((Name *)(plVar22 + 1))->super_IString).str._M_len;
          *(undefined4 *)((long)&((iStack_40._M_current)->super_IString).str._M_len + 4) = uVar7;
          *(int *)&((iStack_40._M_current)->super_IString).str._M_str = (int)lVar6;
          *(undefined4 *)((long)&((iStack_40._M_current)->super_IString).str._M_str + 4) = uVar8;
          iStack_40._M_current = iStack_40._M_current + 1;
        }
        psVar19 = local_48;
        plVar22 = (long *)*plVar22;
      } while (plVar22 != (long *)0x0);
      if (local_48 != (string_view *)iStack_40._M_current) {
        uVar14 = (long)iStack_40._M_current - (long)local_48 >> 4;
        lVar6 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<wasm::Name*,std::vector<wasm::Name,std::allocator<wasm::Name>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_48,iStack_40._M_current,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<wasm::Name*,std::vector<wasm::Name,std::allocator<wasm::Name>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (psVar19);
      }
      if ((string_view *)iStack_40._M_current != local_48) {
        this_00 = &local_50->stringIndexes;
        uVar14 = 0;
        do {
          pmVar15 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,(key_type *)(local_48 + uVar14));
          pWVar9 = local_50;
          *pmVar15 = (mapped_type)uVar14;
          uVar14 = (ulong)((mapped_type)uVar14 + 1);
          uVar23 = (long)iStack_40._M_current - (long)local_48 >> 4;
        } while (uVar14 < uVar23);
        if ((string_view *)iStack_40._M_current != local_48) {
          iVar12 = startSection<wasm::BinaryConsts::Section>(local_50,Strings);
          local_58 = (pointer)CONCAT44(local_58._4_4_,iVar12);
          auStack_2a8 = (undefined1  [8])((ulong)auStack_2a8 & 0xffffffff00000000);
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)auStack_2a8,(int)pWVar9->o,__buf,in_RCX);
          auStack_2a8._0_4_ = (int)uVar23;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)auStack_2a8,(int)pWVar9->o,__buf_00,in_RCX)
          ;
          iVar10._M_current = (Name *)iStack_40;
          if (local_48 != (string_view *)iStack_40._M_current) {
            psVar19 = local_48;
            do {
              std::__cxx11::stringstream::stringstream((stringstream *)auStack_2a8);
              bVar11 = String::convertWTF16ToWTF8(local_298,*psVar19);
              if (!bVar11) {
                __assert_fail("valid",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                              ,0x228,"void wasm::WasmBinaryWriter::writeStrings()");
              }
              std::__cxx11::stringbuf::str();
              name._M_str = (char *)local_80;
              name._M_len = local_78;
              writeInlineString(local_50,name);
              if (local_80 != &local_70) {
                operator_delete(local_80,local_70._0_8_ + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)auStack_2a8);
              std::ios_base::~ios_base(local_228);
              psVar19 = psVar19 + 1;
            } while (psVar19 != (string_view *)iVar10._M_current);
          }
          finishSection(local_50,(int32_t)local_58);
        }
      }
      if (local_48 != (string_view *)0x0) {
        operator_delete(local_48,(long)local_38 - (long)local_48);
      }
    }
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&analysis.field_0x30);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
               *)&analysis);
  return;
}

Assistant:

void WasmBinaryWriter::writeStrings() {
  assert(wasm->features.hasStrings());

  // Scan the entire wasm to find the relevant strings.
  // To find all the string literals we must scan all the code.
  using StringSet = std::unordered_set<Name>;

  struct StringWalker : public PostWalker<StringWalker> {
    StringSet& strings;

    StringWalker(StringSet& strings) : strings(strings) {}

    void visitStringConst(StringConst* curr) { strings.insert(curr->string); }
  };

  ModuleUtils::ParallelFunctionAnalysis<StringSet> analysis(
    *wasm, [&](Function* func, StringSet& strings) {
      if (!func->imported()) {
        StringWalker(strings).walk(func->body);
      }
    });

  // Also walk the global module code (for simplicity, also add it to the
  // function map, using a "function" key of nullptr).
  auto& globalStrings = analysis.map[nullptr];
  StringWalker(globalStrings).walkModuleCode(wasm);

  // Generate the indexes from the combined set of necessary strings,
  // which we sort for determinism.
  StringSet allStrings;
  for (auto& [func, strings] : analysis.map) {
    for (auto& string : strings) {
      allStrings.insert(string);
    }
  }
  std::vector<Name> sorted;
  for (auto& string : allStrings) {
    sorted.push_back(string);
  }
  std::sort(sorted.begin(), sorted.end());
  for (Index i = 0; i < sorted.size(); i++) {
    stringIndexes[sorted[i]] = i;
  }

  auto num = sorted.size();
  if (num == 0) {
    return;
  }

  auto start = startSection(BinaryConsts::Section::Strings);

  // Placeholder for future use in the spec.
  o << U32LEB(0);

  // The number of strings and then their contents.
  o << U32LEB(num);
  for (auto& string : sorted) {
    // Re-encode from WTF-16 to WTF-8.
    std::stringstream wtf8;
    [[maybe_unused]] bool valid = String::convertWTF16ToWTF8(wtf8, string.str);
    assert(valid);
    // TODO: Use wtf8.view() once we have C++20.
    writeInlineString(wtf8.str());
  }

  finishSection(start);
}